

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compress_insertDictionary
                 (ZSTD_compressedBlockState_t *bs,ZSTD_matchState_t *ms,ldmState_t *ls,
                 ZSTD_cwksp *ws,ZSTD_CCtx_params *params,void *dict,size_t dictSize,
                 ZSTD_dictContentType_e dictContentType,ZSTD_dictTableLoadMethod_e dtlm,
                 void *workspace)

{
  uint uVar1;
  size_t err_code;
  long lVar2;
  size_t sVar3;
  ulong uVar4;
  uint uVar5;
  ulong srcSize;
  uint local_84;
  size_t local_80;
  short local_78 [36];
  
  if (dict == (void *)0x0 || dictSize < 8) {
    return (ulong)(dictContentType != ZSTD_dct_fullDict) * 0x20 - 0x20;
  }
  lVar2 = 0;
  do {
    *(undefined4 *)((long)bs->rep + lVar2) = *(undefined4 *)((long)repStartValue + lVar2);
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0xc);
  (bs->entropy).huf.repeatMode = HUF_repeat_none;
  (bs->entropy).fse.offcode_repeatMode = FSE_repeat_none;
  (bs->entropy).fse.matchlength_repeatMode = FSE_repeat_none;
  (bs->entropy).fse.litlength_repeatMode = FSE_repeat_none;
  if (dictContentType != ZSTD_dct_rawContent) {
    if (*dict == -0x13cf5bc9) {
      local_84 = 0x1f;
      if ((params->fParams).noDictIDFlag == 0) {
        local_80 = (size_t)*(uint *)((long)dict + 4);
      }
      else {
        local_80 = 0;
      }
      sVar3 = ZSTD_loadCEntropy(bs,workspace,local_78,&local_84,dict,dictSize);
      if (0xffffffffffffff88 < sVar3) {
        return sVar3;
      }
      srcSize = dictSize - sVar3;
      uVar5 = (int)srcSize + 0x20000;
      uVar1 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      uVar5 = 0x1f;
      if (srcSize >> 0x11 < 0x7fff) {
        uVar5 = uVar1;
      }
      if (local_84 < uVar5) {
        return 0xffffffffffffffe2;
      }
      uVar4 = 0;
      do {
        if (local_78[uVar4] == 0) {
          return 0xffffffffffffffe2;
        }
        uVar4 = uVar4 + 1;
      } while (uVar5 + 1 != uVar4);
      lVar2 = 0;
      while( true ) {
        if ((ulong)bs->rep[lVar2] == 0) {
          return 0xffffffffffffffe2;
        }
        if (srcSize < bs->rep[lVar2]) break;
        lVar2 = lVar2 + 1;
        if (lVar2 == 3) {
          (bs->entropy).fse.offcode_repeatMode = FSE_repeat_valid;
          (bs->entropy).fse.matchlength_repeatMode = FSE_repeat_valid;
          (bs->entropy).fse.litlength_repeatMode = FSE_repeat_valid;
          ZSTD_loadDictionaryContent
                    (ms,(ldmState_t *)0x0,ws,params,(void *)((long)dict + sVar3),srcSize,dtlm);
          return local_80;
        }
      }
      return 0xffffffffffffffe2;
    }
    if (dictContentType == ZSTD_dct_fullDict) {
      return 0xffffffffffffffe0;
    }
    if (dictContentType != ZSTD_dct_auto) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3620,
                    "size_t ZSTD_compress_insertDictionary(ZSTD_compressedBlockState_t *, ZSTD_matchState_t *, ldmState_t *, ZSTD_cwksp *, const ZSTD_CCtx_params *, const void *, size_t, ZSTD_dictContentType_e, ZSTD_dictTableLoadMethod_e, void *)"
                   );
    }
  }
  ZSTD_loadDictionaryContent(ms,ls,ws,params,dict,dictSize,dtlm);
  return 0;
}

Assistant:

static size_t
ZSTD_compress_insertDictionary(ZSTD_compressedBlockState_t* bs,
                               ZSTD_matchState_t* ms,
                               ldmState_t* ls,
                               ZSTD_cwksp* ws,
                         const ZSTD_CCtx_params* params,
                         const void* dict, size_t dictSize,
                               ZSTD_dictContentType_e dictContentType,
                               ZSTD_dictTableLoadMethod_e dtlm,
                               void* workspace)
{
    DEBUGLOG(4, "ZSTD_compress_insertDictionary (dictSize=%u)", (U32)dictSize);
    if ((dict==NULL) || (dictSize<8)) {
        RETURN_ERROR_IF(dictContentType == ZSTD_dct_fullDict, dictionary_wrong);
        return 0;
    }

    ZSTD_reset_compressedBlockState(bs);

    /* dict restricted modes */
    if (dictContentType == ZSTD_dct_rawContent)
        return ZSTD_loadDictionaryContent(ms, ls, ws, params, dict, dictSize, dtlm);

    if (MEM_readLE32(dict) != ZSTD_MAGIC_DICTIONARY) {
        if (dictContentType == ZSTD_dct_auto) {
            DEBUGLOG(4, "raw content dictionary detected");
            return ZSTD_loadDictionaryContent(
                ms, ls, ws, params, dict, dictSize, dtlm);
        }
        RETURN_ERROR_IF(dictContentType == ZSTD_dct_fullDict, dictionary_wrong);
        assert(0);   /* impossible */
    }

    /* dict as full zstd dictionary */
    return ZSTD_loadZstdDictionary(
        bs, ms, ws, params, dict, dictSize, dtlm, workspace);
}